

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O2

void __thiscall QBoxLayout::insertStretch(QBoxLayout *this,int index,int stretch)

{
  QBoxLayoutPrivate *this_00;
  Policy vPolicy;
  int iVar1;
  QSpacerItem *pQVar2;
  parameter_type t;
  Policy hPolicy;
  
  this_00 = *(QBoxLayoutPrivate **)&(this->super_QLayout).field_0x8;
  iVar1 = QBoxLayoutPrivate::validateIndex(this_00,index);
  if (this_00->dir < Down) {
    hPolicy = Expanding;
    vPolicy = Minimum;
  }
  else {
    hPolicy = Minimum;
    vPolicy = Expanding;
  }
  pQVar2 = QLayoutPrivate::createSpacerItem(&this->super_QLayout,0,0,hPolicy,vPolicy);
  t = (parameter_type)operator_new(0x10);
  t->item = &pQVar2->super_QLayoutItem;
  t->stretch = stretch;
  t->magic = true;
  QList<QBoxLayoutItem_*>::insert(&this_00->list,(long)iVar1,t);
  (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
  return;
}

Assistant:

void QBoxLayout::insertStretch(int index, int stretch)
{
    Q_D(QBoxLayout);
    index = d->validateIndex(index);
    QLayoutItem *b;
    if (horz(d->dir))
        b = QLayoutPrivate::createSpacerItem(this, 0, 0, QSizePolicy::Expanding, QSizePolicy::Minimum);
    else
        b = QLayoutPrivate::createSpacerItem(this, 0, 0, QSizePolicy::Minimum, QSizePolicy::Expanding);

    QBoxLayoutItem *it = new QBoxLayoutItem(b, stretch);
    it->magic = true;
    d->list.insert(index, it);
    invalidate();
}